

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O1

void sf::priv::GlContext::acquireTransientContext(void)

{
  void *pvVar1;
  undefined4 *value;
  Lock *this;
  Context *this_00;
  int *piVar2;
  Lock lock;
  Lock local_20;
  
  Lock::Lock(&local_20,(Mutex *)&(anonymous_namespace)::GlContextImpl::mutex);
  pvVar1 = ThreadLocal::getValue
                     ((ThreadLocal *)&(anonymous_namespace)::GlContextImpl::transientContext);
  if (pvVar1 == (void *)0x0) {
    value = (undefined4 *)operator_new(0x20);
    *value = 0;
    *(undefined8 *)(value + 2) = 0;
    *(undefined8 *)(value + 4) = 0;
    *(undefined1 *)(value + 6) = 0;
    if ((anonymous_namespace)::GlContextImpl::resourceCount == 0) {
      this_00 = (Context *)operator_new(8);
      Context::Context(this_00);
      *(Context **)(value + 2) = this_00;
    }
    else {
      pvVar1 = ThreadLocal::getValue
                         ((ThreadLocal *)&(anonymous_namespace)::GlContextImpl::currentContext);
      if (pvVar1 == (void *)0x0) {
        this = (Lock *)operator_new(8);
        Lock::Lock(this,(Mutex *)&(anonymous_namespace)::GlContextImpl::mutex);
        *(Lock **)(value + 4) = this;
        *(undefined1 *)(value + 6) = 1;
        setActive((anonymous_namespace)::GlContextImpl::sharedContext,true);
      }
    }
    ThreadLocal::setValue
              ((ThreadLocal *)&(anonymous_namespace)::GlContextImpl::transientContext,value);
  }
  piVar2 = (int *)ThreadLocal::getValue
                            ((ThreadLocal *)&(anonymous_namespace)::GlContextImpl::transientContext)
  ;
  *piVar2 = *piVar2 + 1;
  Lock::~Lock(&local_20);
  return;
}

Assistant:

void GlContext::acquireTransientContext()
{
    using GlContextImpl::mutex;
    using GlContextImpl::TransientContext;
    using GlContextImpl::transientContext;

    // Protect from concurrent access
    Lock lock(mutex);

    // If this is the first TransientContextLock on this thread
    // construct the state object
    if (!transientContext)
        transientContext = new TransientContext;

    // Increase the reference count
    transientContext->referenceCount++;
}